

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_value_tmp_tests.hpp
# Opt level: O0

string * __thiscall
iutest::tr1::
ValueTmpParamTestInstance<iu_TestValueType_x_iutest_x_Equal_Test,iutest::detail::VariadicTypeList<iutest::TemplateValue<10l>,iutest::TemplateValue<0l>>>
::MakeTestSuiteName_abi_cxx11_
          (string *__return_storage_ptr__,
          ValueTmpParamTestInstance<iu_TestValueType_x_iutest_x_Equal_Test,iutest::detail::VariadicTypeList<iutest::TemplateValue<10l>,iutest::TemplateValue<0l>>>
          *this,char *testsuite,size_t index)

{
  string local_1e0 [32];
  stringstream local_1c0 [8];
  iu_stringstream strm;
  allocator<char> local_22;
  byte local_21;
  char *local_20;
  size_t index_local;
  char *testsuite_local;
  string *name;
  
  local_21 = 0;
  local_20 = testsuite;
  index_local = (size_t)this;
  testsuite_local = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)this,&local_22);
  std::allocator<char>::~allocator(&local_22);
  std::__cxx11::stringstream::stringstream(local_1c0);
  std::ostream::operator<<(&strm.field_0x8,(ulong)local_20);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_1e0);
  std::__cxx11::string::~string(local_1e0);
  local_21 = 1;
  std::__cxx11::stringstream::~stringstream(local_1c0);
  if ((local_21 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static ::std::string MakeTestSuiteName(const char* testsuite, size_t index)
    {
        ::std::string name = testsuite;
        iu_stringstream strm; strm << index;
        name += "/";
        name += strm.str();
        return name;
    }